

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,undefined8 param_3)

{
  long *plVar1;
  undefined8 uVar2;
  TestStatus *pTVar3;
  deUint32 dVar4;
  pointer __s;
  Resources *this;
  long *plVar5;
  int *piVar6;
  ThreadGroupThread *this_00;
  uint uVar7;
  ulong __n;
  ulong uVar8;
  long lVar9;
  Environment env;
  ThreadGroup threads;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_d8;
  TestStatus *local_c8;
  long local_c0;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  local_b8;
  undefined8 local_a0;
  Environment local_98;
  ThreadGroup local_60;
  
  local_c8 = __return_storage_ptr__;
  local_a0 = param_3;
  dVar4 = deGetNumAvailableLogicalCores();
  uVar7 = 8;
  if (dVar4 < 8) {
    uVar7 = dVar4;
  }
  uVar8 = 2;
  if (2 < uVar7) {
    uVar8 = (ulong)uVar7;
  }
  local_98.vkp = context->m_platformInterface;
  local_98.vkd = Context::getDeviceInterface(context);
  local_98.device = Context::getDevice(context);
  local_98.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_98.programBinaries = context->m_progCollection;
  local_98.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_98.maxResourceConsumers = 1;
  __n = (ulong)(uint)((int)uVar8 << 4);
  __s = (pointer)operator_new(__n);
  local_b8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_start = __s;
  memset(__s,0,__n);
  local_b8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)&__s->m_ptr + __n);
  local_b8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8.
       super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ThreadGroup::ThreadGroup(&local_60);
  local_c0 = uVar8 << 4;
  lVar9 = 0;
  do {
    this = (Resources *)operator_new(0x1b8);
    Device::Resources::Resources(this,&local_98,(Parameters *)&local_a0);
    plVar5 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar5 + 1) = 0;
    *(undefined4 *)((long)plVar5 + 0xc) = 0;
    *plVar5 = (long)&PTR__SharedPtrState_00d24608;
    plVar5[2] = (long)this;
    *(undefined4 *)(plVar5 + 1) = 1;
    *(undefined4 *)((long)plVar5 + 0xc) = 1;
    plVar1 = *(long **)((long)&__s->m_state + lVar9);
    if (plVar1 != plVar5) {
      if (plVar1 != (long *)0x0) {
        LOCK();
        plVar1 = plVar1 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        UNLOCK();
        if ((int)*plVar1 == 0) {
          *(undefined8 *)((long)&__s->m_ptr + lVar9) = 0;
          (**(code **)(**(long **)((long)&__s->m_state + lVar9) + 0x10))();
        }
        LOCK();
        piVar6 = (int *)(*(long *)((long)&__s->m_state + lVar9) + 0xc);
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          plVar1 = *(long **)((long)&__s->m_state + lVar9);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 8))();
          }
          *(undefined8 *)((long)&__s->m_state + lVar9) = 0;
        }
      }
      *(Resources **)((long)&__s->m_ptr + lVar9) = this;
      *(long **)((long)&__s->m_state + lVar9) = plVar5;
      LOCK();
      *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
      UNLOCK();
      LOCK();
      piVar6 = (int *)(*(long *)((long)&__s->m_state + lVar9) + 0xc);
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    plVar1 = plVar5 + 1;
    LOCK();
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar5 + 0x10))(plVar5);
    }
    piVar6 = (int *)((long)plVar5 + 0xc);
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      (**(code **)(*plVar5 + 8))(plVar5);
    }
    this_00 = (ThreadGroupThread *)operator_new(0x88);
    __s = local_b8.
          super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = *(undefined8 *)
             ((long)&(local_b8.
                      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9);
    ThreadGroupThread::ThreadGroupThread(this_00);
    (this_00->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00d24648;
    this_00[1].super_Thread._vptr_Thread = (_func_int **)&local_98;
    *(undefined8 *)&this_00[1].super_Thread.m_attribs = uVar2;
    this_00[1].super_Thread.m_thread = (deThread)&local_a0;
    local_d8.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this_00;
    ThreadGroup::add(&local_60,&local_d8);
    if (local_d8.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_d8.
          super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_d8.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    pTVar3 = local_c8;
    lVar9 = lVar9 + 0x10;
  } while (local_c0 != lVar9);
  ThreadGroup::run(local_c8,&local_60);
  de::SpinBarrier::~SpinBarrier(&local_60.m_barrier);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
  ::~vector(&local_60.m_threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ::~vector(&local_b8);
  return pTVar3;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}